

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.cpp
# Opt level: O1

void __thiscall Test::Suite::Suite(Suite *this,string *name)

{
  allocator<char> local_2c;
  allocator<char> local_2b;
  allocator_type local_2a;
  allocator_type local_29;
  
  this->_vptr_Suite = (_func_int **)&PTR__Suite_00133a18;
  std::__cxx11::string::string((string *)&this->suiteName,name);
  std::vector<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>::vector
            (&this->testMethods,(initializer_list<Test::Suite::TestMethod>)ZEXT816(0),&local_29);
  std::vector<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>::vector
            (&this->subSuites,(initializer_list<std::shared_ptr<Test::Suite>_>)ZEXT816(0),&local_2a)
  ;
  std::__cxx11::string::string((string *)&this->currentTestMethodName,"",&local_2b);
  std::__cxx11::string::string((string *)&this->currentTestMethodArgs,"",&local_2c);
  (this->totalDuration).__r = 0;
  this->output = (Output *)0x0;
  this->positiveTestMethods = 0;
  this->continueAfterFail = true;
  this->currentTestSucceeded = false;
  return;
}

Assistant:

Suite::Suite(const std::string &name)
    : suiteName(name), testMethods({}), subSuites({}), currentTestMethodName(""), currentTestMethodArgs(""),
      totalDuration(std::chrono::microseconds::zero()), output(nullptr), positiveTestMethods(0),
      continueAfterFail(true), currentTestSucceeded(false) {}